

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitCallRef
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,CallRef *curr,
          optional<wasm::HeapType> ht)

{
  size_t sVar1;
  size_t sVar2;
  Expression **childp;
  Type *pTVar3;
  size_t i;
  ulong index;
  Signature SVar4;
  HeapType local_68;
  Type local_60;
  Type local_58;
  Type params;
  _Storage<wasm::HeapType,_true> local_40;
  optional<wasm::HeapType> ht_local;
  
  local_40 = ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  ht_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  if (((undefined1  [16])
       ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    local_68 = wasm::Type::getHeapType(&curr->target->type);
    _local_58 = HeapType::getSignature(&local_68);
    std::optional<wasm::HeapType>::operator=
              ((optional<wasm::HeapType> *)&local_40._M_value,(Signature *)&stack0xffffffffffffffa8)
    ;
  }
  SVar4 = HeapType::getSignature(&local_40._M_value);
  local_58.id = SVar4.params.id.id;
  sVar2 = (curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  sVar1 = wasm::Type::size(&stack0xffffffffffffffa8);
  if (sVar2 == sVar1) {
    index = 0;
    while( true ) {
      sVar2 = wasm::Type::size(&stack0xffffffffffffffa8);
      if (sVar2 <= index) break;
      childp = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                         (&(curr->operands).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          ,index);
      pTVar3 = wasm::Type::operator[](&stack0xffffffffffffffa8,index);
      IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                ((ConstraintCollector *)this,childp,(Type)pTVar3->id);
      index = index + 1;
    }
    wasm::Type::Type(&local_60,local_40._M_value.id,Nullable,Inexact);
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,&curr->target,local_60);
    return;
  }
  __assert_fail("curr->operands.size() == params.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                ,0x34b,
                "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitCallRef(CallRef *, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
               );
}

Assistant:

void visitCallRef(CallRef* curr, std::optional<HeapType> ht = std::nullopt) {
    if (!ht) {
      ht = curr->target->type.getHeapType().getSignature();
    }
    auto params = ht->getSignature().params;
    assert(curr->operands.size() == params.size());
    for (size_t i = 0; i < params.size(); ++i) {
      note(&curr->operands[i], params[i]);
    }
    note(&curr->target, Type(*ht, Nullable));
  }